

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

child_t<clipp::parameter,_clipp::group> * __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::operator=
          (child_t<clipp::parameter,_clipp::group> *this,
          child_t<clipp::parameter,_clipp::group> *src)

{
  type tVar1;
  long in_RSI;
  child_t<clipp::parameter,_clipp::group> *in_RDI;
  parameter *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  destroy_content((child_t<clipp::parameter,_clipp::group> *)
                  CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  in_RDI->type_ = *(type *)(in_RSI + 0x100);
  tVar1 = in_RDI->type_;
  if ((tVar1 == param) || (tVar1 != group)) {
    data::data((data *)CONCAT17(tVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else {
    data::data((data *)CONCAT17(1,in_stack_ffffffffffffffe0),(group *)in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

child_t& operator = (child_t&& src) noexcept {
            destroy_content();
            type_ = src.type_;
            switch(type_) {
                default:
                case type::param: new(&m_)data{std::move(src.m_.param)}; break;
                case type::group: new(&m_)data{std::move(src.m_.group)}; break;
            }
            return *this;
        }